

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cpp
# Opt level: O0

void out_AddSection(Section *section)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  SortedSections *pSVar4;
  SortedSection *pSVar5;
  SortedSections *local_38;
  SortedSections *local_30;
  SortedSection **ptr;
  SortedSection *newSection;
  uint32_t i;
  uint32_t minNbBanks;
  uint32_t targetBank;
  Section *section_local;
  
  uVar2 = section->bank - sectionTypeInfo[section->type].firstBank;
  uVar3 = uVar2 + 1;
  if (out_AddSection::maxNbBanks[section->type] < uVar3) {
    errx("Section \"%s\" has an invalid bank range (%u > %u)",section->name,(ulong)section->bank,
         (ulong)(out_AddSection::maxNbBanks[section->type] - 1));
  }
  if (sections[section->type].nbBanks < uVar3) {
    pSVar4 = (SortedSections *)realloc(sections[section->type].banks,(ulong)uVar3 << 4);
    sections[section->type].banks = pSVar4;
    for (newSection._4_4_ = sections[section->type].nbBanks; newSection._4_4_ < uVar3;
        newSection._4_4_ = newSection._4_4_ + 1) {
      sections[section->type].banks[newSection._4_4_].sections = (SortedSection *)0x0;
      sections[section->type].banks[newSection._4_4_].zeroLenSections = (SortedSection *)0x0;
    }
    sections[section->type].nbBanks = uVar3;
  }
  if (sections[section->type].banks == (SortedSections *)0x0) {
    err("Failed to realloc banks");
  }
  pSVar5 = (SortedSection *)malloc(0x10);
  if (section->size == 0) {
    local_38 = (SortedSections *)&sections[section->type].banks[uVar2].zeroLenSections;
  }
  else {
    local_38 = sections[section->type].banks + uVar2;
  }
  local_30 = local_38;
  if (pSVar5 == (SortedSection *)0x0) {
    err("Failed to add new section \"%s\"",section->name);
  }
  pSVar5->section = section;
  while( true ) {
    bVar1 = false;
    if (local_30->sections != (SortedSection *)0x0) {
      bVar1 = local_30->sections->section->org < section->org;
    }
    if (!bVar1) break;
    local_30 = (SortedSections *)&local_30->sections->next;
  }
  pSVar5->next = local_30->sections;
  local_30->sections = pSVar5;
  return;
}

Assistant:

void out_AddSection(struct Section const *section)
{
	static uint32_t maxNbBanks[] = {
		AT(SECTTYPE_WRAM0) 1,
		AT(SECTTYPE_VRAM)  2,
		AT(SECTTYPE_ROMX)  UINT32_MAX,
		AT(SECTTYPE_ROM0)  1,
		AT(SECTTYPE_HRAM)  1,
		AT(SECTTYPE_WRAMX) 7,
		AT(SECTTYPE_SRAM)  UINT32_MAX,
		AT(SECTTYPE_OAM)   1,
	};

	uint32_t targetBank = section->bank - sectionTypeInfo[section->type].firstBank;
	uint32_t minNbBanks = targetBank + 1;

	if (minNbBanks > maxNbBanks[section->type])
		errx("Section \"%s\" has an invalid bank range (%" PRIu32 " > %" PRIu32 ")",
		     section->name, section->bank,
		     maxNbBanks[section->type] - 1);

	if (minNbBanks > sections[section->type].nbBanks) {
		sections[section->type].banks =
			(struct SortedSections *)realloc(sections[section->type].banks,
				sizeof(*sections[0].banks) * minNbBanks);
		for (uint32_t i = sections[section->type].nbBanks; i < minNbBanks; i++) {
			sections[section->type].banks[i].sections = NULL;
			sections[section->type].banks[i].zeroLenSections = NULL;
		}
		sections[section->type].nbBanks = minNbBanks;
	}
	if (!sections[section->type].banks)
		err("Failed to realloc banks");

	struct SortedSection *newSection = (struct SortedSection *)malloc(sizeof(*newSection));
	struct SortedSection **ptr = section->size
		? &sections[section->type].banks[targetBank].sections
		: &sections[section->type].banks[targetBank].zeroLenSections;

	if (!newSection)
		err("Failed to add new section \"%s\"", section->name);
	newSection->section = section;

	while (*ptr && (*ptr)->section->org < section->org)
		ptr = &(*ptr)->next;

	newSection->next = *ptr;
	*ptr = newSection;
}